

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::CreateFunction(SQCompiler *this,SQObject *name,bool lambda)

{
  SQUnsignedInteger *pSVar1;
  SQFuncState *this_00;
  SQFuncState *this_01;
  SQFuncState *this_02;
  SQInteger SVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  SQObject SVar6;
  SQObject local_50;
  SQObject local_40;
  
  this_02 = SQFuncState::PushChildState(this->_fs,this->_vm->_sharedstate);
  SQObjectPtr::operator=(&this_02->_name,name);
  SVar6 = SQFuncState::CreateString(this->_fs,"this",-1);
  local_50._unVal = SVar6._unVal;
  local_50._type = SVar6._type;
  SQFuncState::AddParameter(this_02,&local_50);
  SQObjectPtr::operator=(&this_02->_sourcename,&this->_sourcename);
  lVar3 = 0;
  do {
    if (this->_token == 0x29) {
LAB_001120ac:
      Expect(this,0x29);
      lVar4 = 0;
      if (0 < lVar3) {
        lVar4 = lVar3;
      }
      while( true ) {
        this_00 = this->_fs;
        bVar5 = lVar4 == 0;
        lVar4 = lVar4 + -1;
        if (bVar5) break;
        SQFuncState::PopTarget(this_00);
      }
      this->_fs = this_02;
      if (lambda) {
        Expression(this);
        this_01 = this->_fs;
        SVar2 = SQFuncState::PopTarget(this_01);
        SQFuncState::AddInstruction(this_01,_OP_RETURN,1,SVar2,0,0);
      }
      else {
        Statement(this,false);
      }
      SQFuncState::AddLineInfos
                (this_02,(&(this->_lex)._currentline)[(this->_lex)._prevtoken == 10],this->_lineinfo
                 ,true);
      SQFuncState::AddInstruction(this_02,_OP_RETURN,-1,0,0,0);
      SQFuncState::SetStackSize(this_02,0);
      local_50._unVal.pFunctionProto = SQFuncState::BuildProto(this_02);
      this->_fs = this_00;
      local_50._type = OT_FUNCPROTO;
      pSVar1 = &((local_50._unVal.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted
                ._uiRef;
      *pSVar1 = *pSVar1 + 1;
      sqvector<SQObjectPtr>::push_back(&this_00->_functions,(SQObjectPtr *)&local_50);
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_50);
      SQFuncState::PopChildState(this->_fs);
      return;
    }
    if (this->_token == 0x138) {
      if (0 < lVar3) {
        Error(this,"function with default parameters cannot have variable number of parameters");
      }
      SVar6 = SQFuncState::CreateString(this->_fs,"vargv",-1);
      local_50._unVal = SVar6._unVal;
      local_50._type = SVar6._type;
      SQFuncState::AddParameter(this_02,&local_50);
      this_02->_varparams = true;
      Lex(this);
      if (this->_token != 0x29) {
        Error(this,"expected \')\'");
      }
      goto LAB_001120ac;
    }
    SVar6 = Expect(this,0x102);
    local_40._unVal = SVar6._unVal;
    local_40._type = SVar6._type;
    SQFuncState::AddParameter(this_02,&local_40);
    lVar4 = this->_token;
    if (lVar4 == 0x3d) {
      Lex(this);
      Expression(this);
      SVar2 = SQFuncState::TopTarget(this->_fs);
      SQFuncState::AddDefaultParam(this_02,SVar2);
      lVar3 = lVar3 + 1;
LAB_0011201d:
      lVar4 = this->_token;
    }
    else if (0 < lVar3) {
      Error(this,"expected \'=\'");
      goto LAB_0011201d;
    }
    if (lVar4 != 0x29) {
      if (lVar4 == 0x2c) {
        Lex(this);
      }
      else {
        Error(this,"expected \')\' or \',\'");
      }
    }
  } while( true );
}

Assistant:

void CreateFunction(SQObject &name,bool lambda = false)
    {
        SQFuncState *funcstate = _fs->PushChildState(_ss(_vm));
        funcstate->_name = name;
        SQObject paramname;
        funcstate->AddParameter(_fs->CreateString(_SC("this")));
        funcstate->_sourcename = _sourcename;
        SQInteger defparams = 0;
        while(_token!=_SC(')')) {
            if(_token == TK_VARPARAMS) {
                if(defparams > 0) Error(_SC("function with default parameters cannot have variable number of parameters"));
                funcstate->AddParameter(_fs->CreateString(_SC("vargv")));
                funcstate->_varparams = true;
                Lex();
                if(_token != _SC(')')) Error(_SC("expected ')'"));
                break;
            }
            else {
                paramname = Expect(TK_IDENTIFIER);
                funcstate->AddParameter(paramname);
                if(_token == _SC('=')) {
                    Lex();
                    Expression();
                    funcstate->AddDefaultParam(_fs->TopTarget());
                    defparams++;
                }
                else {
                    if(defparams > 0) Error(_SC("expected '='"));
                }
                if(_token == _SC(',')) Lex();
                else if(_token != _SC(')')) Error(_SC("expected ')' or ','"));
            }
        }
        Expect(_SC(')'));
        for(SQInteger n = 0; n < defparams; n++) {
            _fs->PopTarget();
        }

        SQFuncState *currchunk = _fs;
        _fs = funcstate;
        if(lambda) {
            Expression();
            _fs->AddInstruction(_OP_RETURN, 1, _fs->PopTarget());}
        else {
            Statement(false);
        }
        funcstate->AddLineInfos(_lex._prevtoken == _SC('\n')?_lex._lasttokenline:_lex._currentline, _lineinfo, true);
        funcstate->AddInstruction(_OP_RETURN, -1);
        funcstate->SetStackSize(0);

        SQFunctionProto *func = funcstate->BuildProto();
#ifdef _DEBUG_DUMP
        funcstate->Dump(func);
#endif
        _fs = currchunk;
        _fs->_functions.push_back(func);
        _fs->PopChildState();
    }